

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::AccessToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawIndirectBase *this,GLbitfield access)

{
  string *extraout_RAX;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = (int)this;
  if (iVar2 == 35000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "GL_READ_ONLY";
    pcVar1 = "";
  }
  else if (iVar2 == 0x88b9) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "GL_WRITE_ONLY";
    pcVar1 = "";
  }
  else {
    if (iVar2 != 0x88ba) {
      this_00 = (runtime_error *)
                __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,access));
      std::runtime_error::runtime_error(this_00,"Invalid access type!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "GL_READ_WRITE";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return extraout_RAX;
}

Assistant:

std::string AccessToString(GLbitfield access)
	{
		switch (access)
		{
		case GL_READ_WRITE:
			return "GL_READ_WRITE";
			break;
		case GL_READ_ONLY:
			return "GL_READ_ONLY";
			break;
		case GL_WRITE_ONLY:
			return "GL_WRITE_ONLY";
			break;
		default:
			throw std::runtime_error("Invalid access type!");
			break;
		}
	}